

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialogbuttonbox.cpp
# Opt level: O0

bool __thiscall
QDialogButtonBoxPrivate::handleButtonShowAndHide
          (QDialogButtonBoxPrivate *this,QAbstractButton *button,QEvent *event)

{
  bool bVar1;
  Type TVar2;
  ButtonRole BVar3;
  QEvent *in_RDX;
  QAbstractButton *in_RSI;
  QDialogButtonBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QDialogButtonBoxPrivate *unaff_retaddr;
  QDialogButtonBoxPrivate *in_stack_00000008;
  ButtonRole role_1;
  Type type;
  QDialogButtonBox *q;
  ButtonRole role;
  QDialogButtonBoxPrivate *in_stack_00000048;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  Type TVar4;
  QDialogButtonBoxPrivate *this_00;
  AddRule in_stack_fffffffffffffff4;
  QDialogButtonBoxPrivate *this_01;
  
  this_01 = *(QDialogButtonBoxPrivate **)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  q_func(in_RDI);
  TVar2 = QEvent::type(in_RDX);
  if (((TVar2 == HideToParent) || (TVar2 == ShowToParent)) &&
     ((in_RDI->ignoreShowAndHide & 1U) == 0)) {
    if (TVar2 == ShowToParent) {
      bVar1 = QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
              ::contains((QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
                          *)in_RDI,(QAbstractButton **)CONCAT44(0x1a,in_stack_ffffffffffffffa0));
      if (bVar1) {
        BVar3 = QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
                ::take((QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
                        *)CONCAT44(TVar2,in_stack_ffffffffffffffb0),(QAbstractButton **)in_RDI);
        addButton(in_stack_00000008,(QAbstractButton *)unaff_retaddr,
                  (ButtonRole)((ulong)this_01 >> 0x20),(LayoutRule)this_01,in_stack_fffffffffffffff4
                 );
        if (BVar3 == AcceptRole) {
          ensureFirstAcceptIsDefault(unaff_retaddr);
        }
      }
    }
    else if ((TVar2 == HideToParent) &&
            (TVar4 = TVar2, BVar3 = QDialogButtonBox::buttonRole((QDialogButtonBox *)this_00,in_RSI)
            , BVar3 != InvalidRole)) {
      removeButton(this_01,(QAbstractButton *)in_stack_00000008,in_stack_fffffffffffffff4);
      QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
      ::insert((QFlatMap<QAbstractButton_*,_QDialogButtonBox::ButtonRole,_std::less<QAbstractButton_*>,_QVarLengthArray<QAbstractButton_*,_8LL>,_QVarLengthArray<QDialogButtonBox::ButtonRole,_8LL>_>
                *)CONCAT44(TVar4,in_stack_ffffffffffffffb0),(QAbstractButton **)in_RDI,
               (ButtonRole *)CONCAT44(TVar2,in_stack_ffffffffffffffa0));
      layoutButtons(in_stack_00000048);
    }
  }
  if (*(QDialogButtonBoxPrivate **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  return false;
}

Assistant:

bool QDialogButtonBoxPrivate::handleButtonShowAndHide(QAbstractButton *button, QEvent *event)
{
    Q_Q(QDialogButtonBox);

    const QEvent::Type type = event->type();

    if ((type != QEvent::HideToParent && type != QEvent::ShowToParent) || ignoreShowAndHide)
        return false;

    switch (type) {
    case QEvent::HideToParent: {
        const QDialogButtonBox::ButtonRole role = q->buttonRole(button);
        if (role != QDialogButtonBox::ButtonRole::InvalidRole) {
            removeButton(button, RemoveReason::HideEvent);
            hiddenButtons.insert(button, role);
            layoutButtons();
        }
        break;
    }
    case QEvent::ShowToParent:
        if (hiddenButtons.contains(button)) {
            const auto role = hiddenButtons.take(button);
            addButton(button, role, LayoutRule::DoLayout, AddRule::SkipConnect);
            if (role == QDialogButtonBox::AcceptRole)
                ensureFirstAcceptIsDefault();
        }
        break;
    default: break;
    }

    return false;
}